

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O1

uint __thiscall ON_Brep::ClearComponentStates(ON_Brep *this,ON_ComponentStatus states_to_clear)

{
  uchar uVar1;
  uchar uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  ON_BrepVertex *pOVar9;
  ON_BrepEdge *pOVar10;
  ON_BrepTrim *pOVar11;
  ON_BrepLoop *pOVar12;
  ON_BrepFace *pOVar13;
  uint uVar14;
  ON_BrepEdge *pOVar15;
  ON_BrepTrim *pOVar16;
  ON_BrepLoop *pOVar17;
  ON_BrepVertex *pOVar18;
  ON_BrepFace *pOVar19;
  ON_BrepVertex *pOVar20;
  ON_BrepEdge *pOVar21;
  ON_BrepTrim *pOVar22;
  ON_BrepLoop *pOVar23;
  ON_BrepFace *pOVar24;
  ON_ComponentStatus local_3a;
  ON_Brep *local_38;
  
  local_3a = states_to_clear;
  bVar7 = ON_ComponentStatus::IsClear(&local_3a);
  uVar4 = ON_AggregateComponentStatus::NotCurrent._24_8_;
  uVar3 = ON_AggregateComponentStatus::NotCurrent._8_8_;
  uVar5 = ON_AggregateComponentStatus::NotCurrent._0_8_;
  uVar14 = 0;
  if (!bVar7) {
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_hidden_count;
    (this->m_aggregate_status).m_highlighted_count =
         ON_AggregateComponentStatus::NotCurrent.m_highlighted_count;
    uVar6 = ON_AggregateComponentStatus::NotCurrent._24_8_;
    (this->m_aggregate_status).m_hidden_count = uVar14;
    ON_AggregateComponentStatus::NotCurrent.m_locked_count = (uint)uVar4;
    ON_AggregateComponentStatus::NotCurrent.m_damaged_count = SUB84(uVar4,4);
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_damaged_count;
    (this->m_aggregate_status).m_locked_count =
         ON_AggregateComponentStatus::NotCurrent.m_locked_count;
    ON_AggregateComponentStatus::NotCurrent._24_8_ = uVar6;
    uVar4 = ON_AggregateComponentStatus::NotCurrent._0_8_;
    (this->m_aggregate_status).m_damaged_count = uVar14;
    ON_AggregateComponentStatus::NotCurrent.m_aggregate_status = SUB82(uVar5,0);
    ON_AggregateComponentStatus::NotCurrent.m_current = SUB81(uVar5,2);
    uVar1 = ON_AggregateComponentStatus::NotCurrent.m_current;
    ON_AggregateComponentStatus::NotCurrent.m_reserved1 = SUB81(uVar5,3);
    uVar2 = ON_AggregateComponentStatus::NotCurrent.m_reserved1;
    ON_AggregateComponentStatus::NotCurrent.m_component_count = SUB84(uVar5,4);
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_component_count;
    (this->m_aggregate_status).m_aggregate_status =
         ON_AggregateComponentStatus::NotCurrent.m_aggregate_status;
    ON_AggregateComponentStatus::NotCurrent._0_8_ = uVar4;
    uVar5 = ON_AggregateComponentStatus::NotCurrent._8_8_;
    (this->m_aggregate_status).m_current = uVar1;
    (this->m_aggregate_status).m_reserved1 = uVar2;
    (this->m_aggregate_status).m_component_count = uVar14;
    ON_AggregateComponentStatus::NotCurrent.m_selected_count = (uint)uVar3;
    ON_AggregateComponentStatus::NotCurrent.m_selected_persistent_count = SUB84(uVar3,4);
    uVar14 = ON_AggregateComponentStatus::NotCurrent.m_selected_persistent_count;
    (this->m_aggregate_status).m_selected_count =
         ON_AggregateComponentStatus::NotCurrent.m_selected_count;
    ON_AggregateComponentStatus::NotCurrent._8_8_ = uVar5;
    (this->m_aggregate_status).m_selected_persistent_count = uVar14;
    pOVar9 = (ON_BrepVertex *)
             (ulong)(uint)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                          super_ON_ClassArray<ON_BrepVertex>.m_count;
    pOVar20 = pOVar9;
    if (pOVar9 != (ON_BrepVertex *)0x0) {
      pOVar20 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                m_a;
    }
    if (pOVar20 == (ON_BrepVertex *)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      pOVar18 = pOVar20;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(&pOVar18->m_status,local_3a);
        uVar14 = uVar14 + uVar8;
        bVar7 = pOVar18 < pOVar20 + (long)((long)&pOVar9[-1].m_tolerance + 7);
        pOVar18 = pOVar18 + 1;
      } while (bVar7 && pOVar20 != (ON_BrepVertex *)0x0);
    }
    pOVar10 = (ON_BrepEdge *)
              (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                           super_ON_ClassArray<ON_BrepEdge>.m_count;
    pOVar21 = pOVar10;
    if (pOVar10 != (ON_BrepEdge *)0x0) {
      pOVar21 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    }
    local_38 = this;
    if (pOVar21 != (ON_BrepEdge *)0x0) {
      pOVar15 = pOVar21;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(&pOVar15->m_status,local_3a);
        uVar14 = uVar14 + uVar8;
        bVar7 = pOVar15 < pOVar21 + (long)((long)&pOVar10[-1].m_brep + 7);
        pOVar15 = pOVar15 + 1;
      } while (bVar7 && pOVar21 != (ON_BrepEdge *)0x0);
    }
    pOVar11 = (ON_BrepTrim *)
              (ulong)(uint)(local_38->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                           super_ON_ClassArray<ON_BrepTrim>.m_count;
    pOVar22 = pOVar11;
    if (pOVar11 != (ON_BrepTrim *)0x0) {
      pOVar22 = (local_38->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                m_a;
    }
    if (pOVar22 != (ON_BrepTrim *)0x0) {
      pOVar16 = pOVar22;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(&pOVar16->m_status,local_3a);
        uVar14 = uVar14 + uVar8;
        bVar7 = pOVar16 < pOVar22 + (long)((long)&pOVar11[-1].m_brep + 7);
        pOVar16 = pOVar16 + 1;
      } while (bVar7 && pOVar22 != (ON_BrepTrim *)0x0);
    }
    pOVar12 = (ON_BrepLoop *)
              (ulong)(uint)(local_38->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_count;
    pOVar23 = pOVar12;
    if (pOVar12 != (ON_BrepLoop *)0x0) {
      pOVar23 = (local_38->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                m_a;
    }
    if (pOVar23 != (ON_BrepLoop *)0x0) {
      pOVar17 = pOVar23;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(&pOVar17->m_status,local_3a);
        uVar14 = uVar14 + uVar8;
        bVar7 = pOVar17 < pOVar23 + (long)((long)&pOVar12[-1].m_brep + 7);
        pOVar17 = pOVar17 + 1;
      } while (bVar7 && pOVar23 != (ON_BrepLoop *)0x0);
    }
    pOVar13 = (ON_BrepFace *)
              (ulong)(uint)(local_38->m_F).super_ON_ObjectArray<ON_BrepFace>.
                           super_ON_ClassArray<ON_BrepFace>.m_count;
    pOVar24 = pOVar13;
    if (pOVar13 != (ON_BrepFace *)0x0) {
      pOVar24 = (local_38->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_a;
    }
    if (pOVar24 != (ON_BrepFace *)0x0) {
      pOVar19 = pOVar24;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(&pOVar19->m_status,local_3a);
        uVar14 = uVar14 + uVar8;
        bVar7 = pOVar19 < pOVar24 + (long)((long)&pOVar13[-1].m_brep + 7);
        pOVar19 = pOVar19 + 1;
      } while (bVar7 && pOVar24 != (ON_BrepFace *)0x0);
    }
  }
  return uVar14;
}

Assistant:

unsigned int ON_Brep::ClearComponentStates(
  ON_ComponentStatus states_to_clear
  ) const
{
  if (states_to_clear.IsClear())
    return 0U;

  m_aggregate_status = ON_AggregateComponentStatus::NotCurrent;

  unsigned int rc = 0;

  ON_ArrayIterator< const ON_BrepVertex > vit( m_V.Array(), m_V.UnsignedCount() );
  for ( const ON_BrepVertex* p = vit.First(); nullptr != p; p = vit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepEdge > eit( m_E.Array(), m_E.UnsignedCount() );
  for ( const ON_BrepEdge* p = eit.First(); nullptr != p; p = eit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepTrim > tit( m_T.Array(), m_T.UnsignedCount() );
  for ( const ON_BrepTrim* p = tit.First(); nullptr != p; p = tit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepLoop > lit( m_L.Array(), m_L.UnsignedCount() );
  for ( const ON_BrepLoop* p = lit.First(); nullptr != p; p = lit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepFace > fit( m_F.Array(), m_F.UnsignedCount() );
  for ( const ON_BrepFace* p = fit.First(); nullptr != p; p = fit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  return rc;
}